

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm2js.cpp
# Opt level: O0

unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_> __thiscall
anon_unknown.dwarf_b296a::optimizeWasm::OptimizeForJS::create(OptimizeForJS *this)

{
  unique_ptr<OptimizeForJS,_std::default_delete<OptimizeForJS>_> local_20 [2];
  OptimizeForJS *this_local;
  
  this_local = this;
  std::
  make_unique<(anonymous_namespace)::optimizeWasm(wasm::Module&,wasm::PassOptions)::OptimizeForJS>()
  ;
  std::unique_ptr<wasm::Pass,std::default_delete<wasm::Pass>>::
  unique_ptr<(anonymous_namespace)::optimizeWasm(wasm::Module&,wasm::PassOptions)::OptimizeForJS,std::default_delete<(anonymous_namespace)::optimizeWasm(wasm::Module&,wasm::PassOptions)::OptimizeForJS>,void>
            ((unique_ptr<wasm::Pass,std::default_delete<wasm::Pass>> *)this,local_20);
  std::unique_ptr<OptimizeForJS,_std::default_delete<OptimizeForJS>_>::~unique_ptr(local_20);
  return (__uniq_ptr_data<wasm::Pass,_std::default_delete<wasm::Pass>,_true,_true>)
         (__uniq_ptr_data<wasm::Pass,_std::default_delete<wasm::Pass>,_true,_true>)this;
}

Assistant:

std::unique_ptr<Pass> create() override {
      return std::make_unique<OptimizeForJS>();
    }